

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

opj_pi_iterator_t * opj_pi_create_decode(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint p_nb_elements;
  opj_tcp_t *poVar1;
  opj_image_comp_t *poVar2;
  opj_pi_resolution_t *poVar3;
  OPJ_UINT32 *pOVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 **ptr;
  OPJ_UINT32 **p_resolutions;
  opj_pi_iterator_t *p_pi;
  OPJ_INT16 *pOVar6;
  opj_image_comp_t *poVar7;
  OPJ_UINT32 **ppOVar8;
  OPJ_BOOL *pOVar9;
  opj_poc_t *poVar10;
  ulong uVar11;
  OPJ_PROG_ORDER *pOVar12;
  ulong uVar13;
  OPJ_UINT32 OVar14;
  uint uVar15;
  long lVar16;
  opj_pi_comp_t *poVar17;
  int iVar18;
  opj_pi_iterator_t *poVar19;
  uint uVar20;
  bool bVar21;
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x56a,
                  "opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *, opj_cp_t *, OPJ_UINT32)");
  }
  if (p_tile_no < p_cp->th * p_cp->tw) {
    uVar15 = p_image->numcomps;
    uVar13 = (ulong)uVar15;
    poVar1 = p_cp->tcps;
    OVar5 = poVar1[p_tile_no].numpocs;
    ptr = (OPJ_UINT32 **)opj_malloc((ulong)(uVar15 * 0x84) << 2);
    if (ptr != (OPJ_UINT32 **)0x0) {
      p_resolutions = (OPJ_UINT32 **)opj_malloc(uVar13 * 8);
      if (p_resolutions != (OPJ_UINT32 **)0x0) {
        p_pi = opj_pi_create(p_image,p_cp,p_tile_no);
        if (p_pi != (opj_pi_iterator_t *)0x0) {
          p_nb_elements = OVar5 + 1;
          ppOVar8 = ptr;
          for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
            p_resolutions[uVar11] = (OPJ_UINT32 *)ppOVar8;
            ppOVar8 = ppOVar8 + 0x42;
          }
          opj_get_all_encoding_parameters
                    (p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,
                     &l_max_prec,&l_max_res,p_resolutions);
          OVar5 = l_max_prec * uVar15;
          p_pi->include = (OPJ_INT16 *)0x0;
          uVar20 = l_max_res * OVar5;
          uVar15 = poVar1[p_tile_no].numlayers + 1;
          if ((int)((ulong)uVar15 * (ulong)uVar20 >> 0x20) == 0) {
            uVar15 = uVar15 * uVar20;
            p_pi->include_size = uVar15;
            pOVar6 = (OPJ_INT16 *)opj_calloc((ulong)uVar15,2);
            p_pi->include = pOVar6;
            if (pOVar6 != (OPJ_INT16 *)0x0) {
              poVar17 = p_pi->comps;
              poVar2 = p_image->comps;
              p_pi->tx0 = l_tx0;
              p_pi->ty0 = l_ty0;
              p_pi->tx1 = l_tx1;
              p_pi->ty1 = l_ty1;
              p_pi->step_p = 1;
              p_pi->step_c = l_max_prec;
              p_pi->step_r = OVar5;
              p_pi->step_l = uVar20;
              poVar7 = poVar2;
              for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
                poVar3 = poVar17->resolutions;
                pOVar4 = p_resolutions[uVar11];
                OVar14 = poVar7->dy;
                poVar17->dx = poVar7->dx;
                poVar17->dy = OVar14;
                OVar14 = poVar17->numresolutions;
                lVar16 = 0;
                while (bVar21 = OVar14 != 0, OVar14 = OVar14 - 1, bVar21) {
                  *(undefined4 *)((long)&poVar3->pdx + lVar16) =
                       *(undefined4 *)((long)pOVar4 + lVar16);
                  *(undefined4 *)((long)&poVar3->pdy + lVar16) =
                       *(undefined4 *)((long)pOVar4 + lVar16 + 4);
                  *(undefined4 *)((long)&poVar3->pw + lVar16) =
                       *(undefined4 *)((long)pOVar4 + lVar16 + 8);
                  *(undefined4 *)((long)&poVar3->ph + lVar16) =
                       *(undefined4 *)((long)pOVar4 + lVar16 + 0xc);
                  lVar16 = lVar16 + 0x10;
                }
                poVar17 = poVar17 + 1;
                poVar7 = poVar7 + 1;
              }
              poVar19 = p_pi;
              for (uVar15 = 1; uVar15 < p_nb_elements; uVar15 = uVar15 + 1) {
                poVar17 = poVar19[1].comps;
                poVar19[1].tx0 = l_tx0;
                poVar19[1].ty0 = l_ty0;
                poVar19[1].tx1 = l_tx1;
                poVar19[1].ty1 = l_ty1;
                poVar19[1].step_p = 1;
                poVar19[1].step_c = l_max_prec;
                poVar19[1].step_r = OVar5;
                poVar19[1].step_l = uVar20;
                poVar7 = poVar2;
                for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
                  poVar3 = poVar17->resolutions;
                  pOVar4 = p_resolutions[uVar11];
                  OVar14 = poVar7->dy;
                  poVar17->dx = poVar7->dx;
                  poVar17->dy = OVar14;
                  OVar14 = poVar17->numresolutions;
                  lVar16 = 0;
                  while (bVar21 = OVar14 != 0, OVar14 = OVar14 - 1, bVar21) {
                    *(undefined4 *)((long)&poVar3->pdx + lVar16) =
                         *(undefined4 *)((long)pOVar4 + lVar16);
                    *(undefined4 *)((long)&poVar3->pdy + lVar16) =
                         *(undefined4 *)((long)pOVar4 + lVar16 + 4);
                    *(undefined4 *)((long)&poVar3->pw + lVar16) =
                         *(undefined4 *)((long)pOVar4 + lVar16 + 8);
                    *(undefined4 *)((long)&poVar3->ph + lVar16) =
                         *(undefined4 *)((long)pOVar4 + lVar16 + 0xc);
                    lVar16 = lVar16 + 0x10;
                  }
                  poVar17 = poVar17 + 1;
                  poVar7 = poVar7 + 1;
                }
                poVar19[1].include = poVar19->include;
                poVar19[1].include_size = poVar19->include_size;
                poVar19 = poVar19 + 1;
              }
              opj_free(ptr);
              opj_free(p_resolutions);
              iVar18 = poVar1[p_tile_no].numpocs + 1;
              if ((poVar1[p_tile_no].field_0x1638 & 4) != 0) {
                poVar10 = poVar1[p_tile_no].pocs;
                pOVar12 = &(p_pi->poc).prg;
                while (bVar21 = iVar18 != 0, iVar18 = iVar18 + -1, bVar21) {
                  *pOVar12 = poVar10->prg;
                  pOVar12[-10] = 1;
                  OVar5 = poVar10->compno0;
                  ((opj_poc_t *)(pOVar12 + -9))->resno0 = poVar10->resno0;
                  ((opj_poc_t *)(pOVar12 + -9))->compno0 = OVar5;
                  *(undefined8 *)(pOVar12 + -4) = 0;
                  *(undefined8 *)(pOVar12 + -6) = *(undefined8 *)&poVar10->resno1;
                  uVar15 = poVar1[p_tile_no].numlayers;
                  if (poVar10->layno1 < poVar1[p_tile_no].numlayers) {
                    uVar15 = poVar10->layno1;
                  }
                  pOVar12[-7] = uVar15;
                  pOVar12[-2] = l_max_prec;
                  poVar10 = poVar10 + 1;
                  pOVar12 = pOVar12 + 0x3e;
                }
                return p_pi;
              }
              pOVar9 = &p_pi->first;
              while (bVar21 = iVar18 != 0, iVar18 = iVar18 + -1, bVar21) {
                pOVar9[10] = poVar1[p_tile_no].prg;
                *(undefined8 *)pOVar9 = 1;
                pOVar9[2] = 0;
                *(undefined8 *)(pOVar9 + 6) = 0;
                pOVar9[4] = l_max_res;
                pOVar9[5] = pOVar9[0x26];
                pOVar9[3] = poVar1[p_tile_no].numlayers;
                pOVar9[8] = l_max_prec;
                pOVar9 = pOVar9 + 0x3e;
              }
              return p_pi;
            }
          }
          opj_free(ptr);
          opj_free(p_resolutions);
          opj_pi_destroy(p_pi,p_nb_elements);
          return (opj_pi_iterator_t *)0x0;
        }
        opj_free(ptr);
        ptr = p_resolutions;
      }
      opj_free(ptr);
    }
    return (opj_pi_iterator_t *)0x0;
  }
  __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                ,0x56c,
                "opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *, opj_cp_t *, OPJ_UINT32)");
}

Assistant:

opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *p_image,
                                        opj_cp_t *p_cp,
                                        OPJ_UINT32 p_tile_no)
{
    OPJ_UINT32 numcomps = p_image->numcomps;

    /* loop */
    OPJ_UINT32 pino;
    OPJ_UINT32 compno, resno;

    /* to store w, h, dx and dy fro all components and resolutions */
    OPJ_UINT32 * l_tmp_data;
    OPJ_UINT32 ** l_tmp_ptr;

    /* encoding prameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;
    OPJ_UINT32 l_bound;
    OPJ_UINT32 l_step_p, l_step_c, l_step_r, l_step_l ;
    OPJ_UINT32 l_data_stride;

    /* pointers */
    opj_pi_iterator_t *l_pi = 00;
    opj_tcp_t *l_tcp = 00;
    const opj_tccp_t *l_tccp = 00;
    opj_pi_comp_t *l_current_comp = 00;
    opj_image_comp_t * l_img_comp = 00;
    opj_pi_iterator_t * l_current_pi = 00;
    OPJ_UINT32 * l_encoding_value_ptr = 00;

    /* preconditions in debug */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    /* initializations */
    l_tcp = &p_cp->tcps[p_tile_no];
    l_bound = l_tcp->numpocs + 1;

    l_data_stride = 4 * OPJ_J2K_MAXRLVLS;
    l_tmp_data = (OPJ_UINT32*)opj_malloc(
                     l_data_stride * numcomps * sizeof(OPJ_UINT32));
    if
    (! l_tmp_data) {
        return 00;
    }
    l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
                    numcomps * sizeof(OPJ_UINT32 *));
    if
    (! l_tmp_ptr) {
        opj_free(l_tmp_data);
        return 00;
    }

    /* memory allocation for pi */
    l_pi = opj_pi_create(p_image, p_cp, p_tile_no);
    if (!l_pi) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        return 00;
    }

    l_encoding_value_ptr = l_tmp_data;
    /* update pointer array */
    for
    (compno = 0; compno < numcomps; ++compno) {
        l_tmp_ptr[compno] = l_encoding_value_ptr;
        l_encoding_value_ptr += l_data_stride;
    }
    /* get encoding parameters */
    opj_get_all_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1,
                                    &l_ty0, &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res, l_tmp_ptr);

    /* step calculations */
    l_step_p = 1;
    l_step_c = l_max_prec * l_step_p;
    l_step_r = numcomps * l_step_c;
    l_step_l = l_max_res * l_step_r;

    /* set values for first packet iterator */
    l_current_pi = l_pi;

    /* memory allocation for include */
    /* prevent an integer overflow issue */
    /* 0 < l_tcp->numlayers < 65536 c.f. opj_j2k_read_cod in j2k.c */
    l_current_pi->include = 00;
    if (l_step_l <= (UINT_MAX / (l_tcp->numlayers + 1U))) {
        l_current_pi->include_size = (l_tcp->numlayers + 1U) * l_step_l;
        l_current_pi->include = (OPJ_INT16*) opj_calloc(
                                    l_current_pi->include_size, sizeof(OPJ_INT16));
    }

    if (!l_current_pi->include) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        opj_pi_destroy(l_pi, l_bound);
        return 00;
    }

    /* special treatment for the first packet iterator */
    l_current_comp = l_current_pi->comps;
    l_img_comp = p_image->comps;
    l_tccp = l_tcp->tccps;

    l_current_pi->tx0 = l_tx0;
    l_current_pi->ty0 = l_ty0;
    l_current_pi->tx1 = l_tx1;
    l_current_pi->ty1 = l_ty1;

    /*l_current_pi->dx = l_img_comp->dx;*/
    /*l_current_pi->dy = l_img_comp->dy;*/

    l_current_pi->step_p = l_step_p;
    l_current_pi->step_c = l_step_c;
    l_current_pi->step_r = l_step_r;
    l_current_pi->step_l = l_step_l;

    /* allocation for components and number of components has already been calculated by opj_pi_create */
    for
    (compno = 0; compno < numcomps; ++compno) {
        opj_pi_resolution_t *l_res = l_current_comp->resolutions;
        l_encoding_value_ptr = l_tmp_ptr[compno];

        l_current_comp->dx = l_img_comp->dx;
        l_current_comp->dy = l_img_comp->dy;
        /* resolutions have already been initialized */
        for
        (resno = 0; resno < l_current_comp->numresolutions; resno++) {
            l_res->pdx = *(l_encoding_value_ptr++);
            l_res->pdy = *(l_encoding_value_ptr++);
            l_res->pw =  *(l_encoding_value_ptr++);
            l_res->ph =  *(l_encoding_value_ptr++);
            ++l_res;
        }
        ++l_current_comp;
        ++l_img_comp;
        ++l_tccp;
    }
    ++l_current_pi;

    for (pino = 1 ; pino < l_bound ; ++pino) {
        l_current_comp = l_current_pi->comps;
        l_img_comp = p_image->comps;
        l_tccp = l_tcp->tccps;

        l_current_pi->tx0 = l_tx0;
        l_current_pi->ty0 = l_ty0;
        l_current_pi->tx1 = l_tx1;
        l_current_pi->ty1 = l_ty1;
        /*l_current_pi->dx = l_dx_min;*/
        /*l_current_pi->dy = l_dy_min;*/
        l_current_pi->step_p = l_step_p;
        l_current_pi->step_c = l_step_c;
        l_current_pi->step_r = l_step_r;
        l_current_pi->step_l = l_step_l;

        /* allocation for components and number of components has already been calculated by opj_pi_create */
        for
        (compno = 0; compno < numcomps; ++compno) {
            opj_pi_resolution_t *l_res = l_current_comp->resolutions;
            l_encoding_value_ptr = l_tmp_ptr[compno];

            l_current_comp->dx = l_img_comp->dx;
            l_current_comp->dy = l_img_comp->dy;
            /* resolutions have already been initialized */
            for
            (resno = 0; resno < l_current_comp->numresolutions; resno++) {
                l_res->pdx = *(l_encoding_value_ptr++);
                l_res->pdy = *(l_encoding_value_ptr++);
                l_res->pw =  *(l_encoding_value_ptr++);
                l_res->ph =  *(l_encoding_value_ptr++);
                ++l_res;
            }
            ++l_current_comp;
            ++l_img_comp;
            ++l_tccp;
        }
        /* special treatment*/
        l_current_pi->include = (l_current_pi - 1)->include;
        l_current_pi->include_size = (l_current_pi - 1)->include_size;
        ++l_current_pi;
    }
    opj_free(l_tmp_data);
    l_tmp_data = 00;
    opj_free(l_tmp_ptr);
    l_tmp_ptr = 00;
    if
    (l_tcp->POC) {
        opj_pi_update_decode_poc(l_pi, l_tcp, l_max_prec, l_max_res);
    } else {
        opj_pi_update_decode_not_poc(l_pi, l_tcp, l_max_prec, l_max_res);
    }
    return l_pi;
}